

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::teximage2d_invalid_buffer_target
               (NegativeTestContext *ctx)

{
  reference data_00;
  TestLog *this;
  MessageBuilder *this_00;
  MessageBuilder local_268;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 texture;
  deUint32 buf;
  NegativeTestContext *ctx_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1234;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1234;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x40,&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  glu::CallLogWrapper::glGenBuffers
            (&ctx->super_CallLogWrapper,1,
             (GLuint *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  glu::CallLogWrapper::glBindBuffer
            (&ctx->super_CallLogWrapper,0x88ec,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x88ec,0x40,data_00,0x88ea);
  glu::CallLogWrapper::glGenTextures
            (&ctx->super_CallLogWrapper,1,
             (GLuint *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glBindTexture
            (&ctx->super_CallLogWrapper,0xde1,
             (GLuint)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  NegativeTestContext::expectError(ctx,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and..."
             ,&local_69);
  NegativeTestContext::beginSection(ctx,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"...the buffer object\'s data store is currently mapped.",&local_91
            );
  NegativeTestContext::beginSection(ctx,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  glu::CallLogWrapper::glMapBufferRange(&ctx->super_CallLogWrapper,0x88ec,0,0x20,2);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,4,4,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&ctx->super_CallLogWrapper,0x88ec);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size."
             ,&local_b9);
  NegativeTestContext::beginSection(ctx,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,0x40,0x40,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "...data is not evenly divisible into the number of bytes needed to store in memory a datum indicated by type."
             ,&local_e1);
  NegativeTestContext::beginSection(ctx,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  this = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_268,this,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<(&local_268,(char (*) [23])"// Set byte offset = 3");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_268);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x8057,4,4,0,0x1908,0x8034,(void *)0x3);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteBuffers
            (&ctx->super_CallLogWrapper,1,
             (GLuint *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  glu::CallLogWrapper::glDeleteTextures
            (&ctx->super_CallLogWrapper,1,
             (GLuint *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void teximage2d_invalid_buffer_target (NegativeTestContext& ctx)
{
	deUint32				buf = 0x1234;
	deUint32				texture = 0x1234;
	std::vector<GLubyte>	data(64);

	ctx.glGenBuffers			(1, &buf);
	ctx.glBindBuffer			(GL_PIXEL_UNPACK_BUFFER, buf);
	ctx.glBufferData			(GL_PIXEL_UNPACK_BUFFER, 64, &data[0], GL_DYNAMIC_COPY);
	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D, texture);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to the GL_PIXEL_UNPACK_BUFFER target and...");
	ctx.beginSection("...the buffer object's data store is currently mapped.");
	ctx.glMapBufferRange		(GL_PIXEL_UNPACK_BUFFER, 0, 32, GL_MAP_WRITE_BIT);
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer			(GL_PIXEL_UNPACK_BUFFER);
	ctx.endSection();

	ctx.beginSection("...the data would be unpacked from the buffer object such that the memory reads required would exceed the data store size.");
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("...data is not evenly divisible into the number of bytes needed to store in memory a datum indicated by type.");
	ctx.getLog() << TestLog::Message << "// Set byte offset = 3" << TestLog::EndMessage;
	ctx.glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGB5_A1, 4, 4, 0, GL_RGBA, GL_UNSIGNED_SHORT_5_5_5_1, (const GLvoid*)3);
	ctx.expectError				(GL_INVALID_OPERATION);
	ctx.endSection();
	ctx.endSection();

	ctx.glDeleteBuffers			(1, &buf);
	ctx.glDeleteTextures		(1, &texture);
}